

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Dch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int c;
  Dch_Pars_t *pPars;
  Dch_Pars_t Pars;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Dch_ManSetDefaultParams((Dch_Pars_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_0026eece:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"WCSsptfrvh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Dch(): There is no AIG.\n");
        return 1;
      }
      iVar1 = Gia_ManBufNum(pAbc->pGia);
      if (iVar1 != 0) {
        Abc_Print(-1,"Abc_CommandAbc9Dch(): This command does not work with barrier buffers.\n");
        return 1;
      }
      Pars._56_8_ = Gia_ManPerformDch(pAbc->pGia,(Dch_Pars_t *)&pPars);
      Abc_FrameUpdateGia(pAbc,(Gia_Man_t *)Pars._56_8_);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0026f159;
      }
      pPars._4_4_ = atoi(argv[globalUtilOptind]);
      uVar2 = pPars._4_4_;
      break;
    default:
      goto LAB_0026f159;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_0026f159;
      }
      Pars.nWords = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nWords;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_0026f159;
      }
      pPars._0_4_ = atoi(argv[globalUtilOptind]);
      uVar2 = (uint)pPars;
      break;
    case 0x66:
      Pars.fUseGia = Pars.fUseGia ^ 1;
      goto LAB_0026eece;
    case 0x68:
      goto LAB_0026f159;
    case 0x70:
      Pars.fPolarFlip = Pars.fPolarFlip ^ 1;
      goto LAB_0026eece;
    case 0x72:
      Pars.fUseCSat = Pars.fUseCSat ^ 1;
      goto LAB_0026eece;
    case 0x73:
      Pars.nBTLimit = Pars.nBTLimit ^ 1;
      goto LAB_0026eece;
    case 0x74:
      Pars.fSynthesis = Pars.fSynthesis ^ 1;
      goto LAB_0026eece;
    case 0x76:
      Pars.fLightSynth = Pars.fLightSynth ^ 1;
      goto LAB_0026eece;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_0026f159:
      Abc_Print(-2,"usage: &dch [-WCS num] [-sptfrvh]\n");
      Abc_Print(-2,"\t         computes structural choices using a new approach\n");
      Abc_Print(-2,"\t-W num : the max number of simulation words [default = %d]\n",
                (ulong)(uint)pPars);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-S num : the max number of SAT variables [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      pcVar3 = "no";
      if (Pars.nBTLimit != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle synthesizing three snapshots [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fPolarFlip != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-p     : toggle power-aware rewriting [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fSynthesis != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle simulation of the TFO classes [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fUseGia != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-f     : toggle using lighter logic synthesis [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fUseCSat != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r     : toggle skipping choices with redundant support [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (Pars.fLightSynth != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Dch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    Dch_Pars_t Pars, * pPars = &Pars;
    int c;
    // set defaults
    Dch_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCSsptfrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 's':
            pPars->fSynthesis ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 't':
            pPars->fSimulateTfo ^= 1;
            break;
        case 'f':
            pPars->fLightSynth ^= 1;
            break;
        case 'r':
            pPars->fSkipRedSupp ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dch(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dch(): This command does not work with barrier buffers.\n" );
        return 1;
    }
    pTemp = Gia_ManPerformDch( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &dch [-WCS num] [-sptfrvh]\n" );
    Abc_Print( -2, "\t         computes structural choices using a new approach\n" );
    Abc_Print( -2, "\t-W num : the max number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the max number of SAT variables [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-s     : toggle synthesizing three snapshots [default = %s]\n", pPars->fSynthesis? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle power-aware rewriting [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle simulation of the TFO classes [default = %s]\n", pPars->fSimulateTfo? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle using lighter logic synthesis [default = %s]\n", pPars->fLightSynth? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle skipping choices with redundant support [default = %s]\n", pPars->fSkipRedSupp? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}